

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_matrix.cpp
# Opt level: O3

bool __thiscall ExtendedMatrix::SwapRows(ExtendedMatrix *this,int first_row,int second_row)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = Matrix::SwapRows(&this->main_,first_row,second_row);
  bVar2 = Matrix::SwapRows(&this->extension_,first_row,second_row);
  if (bVar2 || bVar1) {
    Permutation::Transposition(&this->row_permutation_,first_row,second_row);
  }
  return bVar2 || bVar1;
}

Assistant:

bool ExtendedMatrix::SwapRows(int first_row, int second_row) {
  bool result = false;
  result |= main_.SwapRows(first_row, second_row);
  result |= extension_.SwapRows(first_row, second_row);

  if (result) {
    row_permutation_.Transposition(first_row, second_row);
  }

  return result;
}